

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O2

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int j;
  
  iVar3 = bottom_top_blob->dims;
  if (iVar3 == 2) {
    uVar8 = bottom_top_blob->w;
    pvVar10 = bottom_top_blob->data;
    pvVar4 = (this->a_data).data;
    pvVar5 = (this->b_data).data;
    uVar13 = 0;
    uVar11 = 0;
    if (0 < (int)uVar8) {
      uVar11 = (ulong)uVar8;
    }
    uVar9 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar9 = uVar13;
    }
    sVar6 = bottom_top_blob->elemsize;
    for (; uVar13 != uVar9; uVar13 = uVar13 + 1) {
      fVar1 = *(float *)((long)pvVar4 + uVar13 * 4);
      fVar2 = *(float *)((long)pvVar5 + uVar13 * 4);
      for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        *(float *)((long)pvVar10 + uVar12 * 4) =
             *(float *)((long)pvVar10 + uVar12 * 4) * fVar2 + fVar1;
      }
      pvVar10 = (void *)((long)pvVar10 + (long)(int)uVar8 * sVar6);
    }
  }
  else if (iVar3 == 1) {
    pvVar10 = bottom_top_blob->data;
    pvVar4 = (this->a_data).data;
    pvVar5 = (this->b_data).data;
    uVar13 = 0;
    uVar11 = (ulong)(uint)bottom_top_blob->w;
    if (bottom_top_blob->w < 1) {
      uVar11 = uVar13;
    }
    for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      *(float *)((long)pvVar10 + uVar13 * 4) =
           *(float *)((long)pvVar10 + uVar13 * 4) * *(float *)((long)pvVar5 + uVar13 * 4) +
           *(float *)((long)pvVar4 + uVar13 * 4);
    }
  }
  if (iVar3 - 3U < 2) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar10 = bottom_top_blob->data;
    sVar6 = bottom_top_blob->cstep;
    pvVar4 = (this->a_data).data;
    pvVar5 = (this->b_data).data;
    uVar13 = 0;
    uVar11 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar11 = uVar13;
    }
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar13;
    }
    sVar7 = bottom_top_blob->elemsize;
    for (; uVar13 != uVar9; uVar13 = uVar13 + 1) {
      fVar1 = *(float *)((long)pvVar4 + uVar13 * 4);
      fVar2 = *(float *)((long)pvVar5 + uVar13 * 4);
      for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        *(float *)((long)pvVar10 + uVar12 * 4) =
             *(float *)((long)pvVar10 + uVar12 * 4) * fVar2 + fVar1;
      }
      pvVar10 = (void *)((long)pvVar10 + sVar6 * sVar7);
    }
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j = 0; j < w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int c = bottom_top_blob.c;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i = 0; i < size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}